

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O1

void __thiscall
ParticleArrayTest_Assignment_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>_>::
TestBody(ParticleArrayTest_Assignment_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>_>
         *this)

{
  void *pvVar1;
  Particle<(pica::Dimension)2> particle;
  Particle<(pica::Dimension)2> particle_00;
  bool bVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  PositionType minPosition;
  PositionType minPosition_00;
  PositionType maxPosition;
  PositionType maxPosition_00;
  AssertionResult gtest_ar_;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_320;
  AssertHelper local_318;
  char *local_310;
  undefined8 uStack_308;
  AssertionResult local_300;
  ParticleArray local_2f0;
  ParticleArray local_230;
  ParticleArray local_170;
  Particle local_b0;
  Particle local_70;
  
  memset(&local_2f0,0,0xc0);
  memset(&local_170,0,0xc0);
  memset(&local_230,0,0xc0);
  iVar4 = 9;
  do {
    minPosition.y = -10.0;
    minPosition.x = -10.0;
    maxPosition.y = 10.0;
    maxPosition.x = 10.0;
    BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>::randomParticle
              (&local_70,(BaseParticleFixture<pica::Particle<(pica::Dimension)2>_> *)this,
               minPosition,maxPosition);
    particle.position.y = local_70.position.y;
    particle.position.x = local_70.position.x;
    particle.p.x = local_70.p.x;
    particle.p.y = local_70.p.y;
    particle.p.z = local_70.p.z;
    particle.factor = local_70.factor;
    particle.invGamma = local_70.invGamma;
    particle.typeIndex = local_70.typeIndex;
    particle._58_6_ = local_70._58_6_;
    pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>>::
    pushBack<pica::Particle<(pica::Dimension)2>>
              ((ParticleArraySoA<pica::Particle<(pica::Dimension)2>> *)&local_2f0,particle);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  iVar4 = 0xb;
  do {
    minPosition_00.y = -10.0;
    minPosition_00.x = -10.0;
    maxPosition_00.y = 10.0;
    maxPosition_00.x = 10.0;
    BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>::randomParticle
              (&local_b0,(BaseParticleFixture<pica::Particle<(pica::Dimension)2>_> *)this,
               minPosition_00,maxPosition_00);
    particle_00.position.y = local_b0.position.y;
    particle_00.position.x = local_b0.position.x;
    particle_00.p.x = local_b0.p.x;
    particle_00.p.y = local_b0.p.y;
    particle_00.p.z = local_b0.p.z;
    particle_00.factor = local_b0.factor;
    particle_00.invGamma = local_b0.invGamma;
    particle_00.typeIndex = local_b0.typeIndex;
    particle_00._58_6_ = local_b0._58_6_;
    pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>>::
    pushBack<pica::Particle<(pica::Dimension)2>>
              ((ParticleArraySoA<pica::Particle<(pica::Dimension)2>> *)&local_170,particle_00);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  lVar5 = 0;
  do {
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)
               ((long)&local_170.positions[0].super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar5),
               (vector<double,_std::allocator<double>_> *)
               ((long)&local_2f0.positions[0].super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar5));
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x30);
  lVar5 = 0x30;
  do {
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)
               ((long)&local_170.positions[0].super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar5),
               (vector<double,_std::allocator<double>_> *)
               ((long)&local_2f0.positions[0].super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar5));
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x78);
  std::vector<double,_std::allocator<double>_>::operator=(&local_170.factors,&local_2f0.factors);
  std::vector<double,_std::allocator<double>_>::operator=(&local_170.invGammas,&local_2f0.invGammas)
  ;
  std::vector<short,_std::allocator<short>_>::operator=(&local_170.typeIndex,&local_2f0.typeIndex);
  lVar5 = 0;
  do {
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)
               ((long)&local_230.positions[0].super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar5),
               (vector<double,_std::allocator<double>_> *)
               ((long)&local_2f0.positions[0].super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar5));
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x30);
  lVar5 = 0x30;
  do {
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)
               ((long)&local_230.positions[0].super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar5),
               (vector<double,_std::allocator<double>_> *)
               ((long)&local_2f0.positions[0].super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar5));
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x78);
  std::vector<double,_std::allocator<double>_>::operator=(&local_230.factors,&local_2f0.factors);
  std::vector<double,_std::allocator<double>_>::operator=(&local_230.invGammas,&local_2f0.invGammas)
  ;
  std::vector<short,_std::allocator<short>_>::operator=(&local_230.typeIndex,&local_2f0.typeIndex);
  bVar2 = ParticleArrayTest<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>_>::
          eqParticleArrays(&this->
                            super_ParticleArrayTest<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>_>
                           ,&local_2f0,&local_170);
  local_300.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  local_300.success_ = bVar2;
  if (bVar2) {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_300.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::Message::Message((Message *)&local_320);
    testing::internal::GetBoolAssertionFailureMessage
              ((internal *)&local_310,&local_300,"this->eqParticleArrays(particles, particlesCopy)",
               "false","true");
    testing::internal::AssertHelper::AssertHelper
              (&local_318,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleArrayTests.cpp"
               ,0x39,local_310);
    testing::internal::AssertHelper::operator=(&local_318,(Message *)&local_320);
    testing::internal::AssertHelper::~AssertHelper(&local_318);
    if (local_310 != (char *)0x0) {
      operator_delete__(local_310);
    }
    if (local_320.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_320.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_320.ptr_ + 8))();
      }
      local_320.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_300.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (!bVar2) goto LAB_0019623d;
  }
  local_300.success_ =
       ParticleArrayTest<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>_>::
       eqParticleArrays(&this->
                         super_ParticleArrayTest<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>_>
                        ,&local_2f0,&local_230);
  local_300.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!local_300.success_) {
    testing::Message::Message((Message *)&local_320);
    testing::internal::GetBoolAssertionFailureMessage
              ((internal *)&local_310,&local_300,
               "this->eqParticleArrays(particles, particlesAnotherCopy)","false","true");
    testing::internal::AssertHelper::AssertHelper
              (&local_318,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleArrayTests.cpp"
               ,0x3a,local_310);
    testing::internal::AssertHelper::operator=(&local_318,(Message *)&local_320);
    testing::internal::AssertHelper::~AssertHelper(&local_318);
    if (local_310 != (char *)0x0) {
      operator_delete__(local_310);
    }
    if (local_320.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_320.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_320.ptr_ + 8))();
      }
      local_320.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_300.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
LAB_0019623d:
  if (local_230.typeIndex.super__Vector_base<short,_std::allocator<short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_230.typeIndex.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_230.typeIndex.super__Vector_base<short,_std::allocator<short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_230.typeIndex.super__Vector_base<short,_std::allocator<short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_230.invGammas.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_230.invGammas.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_230.invGammas.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_230.invGammas.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_230.factors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_230.factors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_230.factors.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_230.factors.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  lVar5 = 0x70;
  do {
    pvVar1 = *(void **)((long)&(((vector<short,_std::allocator<short>_> *)(local_2f0.ps + 5))->
                               super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                               super__Vector_impl_data._M_finish + lVar5);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)&local_230.positions[0].
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_start + lVar5) -
                             (long)pvVar1);
    }
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != 0x28);
  lVar5 = 0x30;
  do {
    pvVar1 = *(void **)((long)&(((vector<short,_std::allocator<short>_> *)(local_2f0.ps + 5))->
                               super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar5);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)local_230.positions + lVar5 + -8) - (long)pvVar1);
    }
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != 0);
  if (local_170.typeIndex.super__Vector_base<short,_std::allocator<short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_170.typeIndex.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_170.typeIndex.super__Vector_base<short,_std::allocator<short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_170.typeIndex.super__Vector_base<short,_std::allocator<short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_170.invGammas.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_170.invGammas.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_170.invGammas.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_170.invGammas.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_170.factors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_170.factors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_170.factors.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_170.factors.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  lVar5 = 0x70;
  do {
    pvVar1 = *(void **)((long)&(((vector<short,_std::allocator<short>_> *)(local_230.ps + 5))->
                               super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                               super__Vector_impl_data._M_finish + lVar5);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)&local_170.positions[0].
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_start + lVar5) -
                             (long)pvVar1);
    }
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != 0x28);
  lVar5 = 0x30;
  do {
    pvVar1 = *(void **)((long)&(((vector<short,_std::allocator<short>_> *)(local_230.ps + 5))->
                               super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar5);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)local_170.positions + lVar5 + -8) - (long)pvVar1);
    }
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != 0);
  if (local_2f0.typeIndex.super__Vector_base<short,_std::allocator<short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2f0.typeIndex.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2f0.typeIndex.super__Vector_base<short,_std::allocator<short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f0.typeIndex.super__Vector_base<short,_std::allocator<short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2f0.invGammas.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2f0.invGammas.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2f0.invGammas.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f0.invGammas.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2f0.factors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2f0.factors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2f0.factors.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f0.factors.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  lVar5 = 0x70;
  do {
    pvVar1 = *(void **)(&local_300.success_ + lVar5);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)&local_2f0.positions[0].
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_start + lVar5) -
                             (long)pvVar1);
    }
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != 0x28);
  lVar5 = 0x30;
  do {
    pvVar1 = *(void **)((long)&uStack_308 + lVar5);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)local_2f0.positions + lVar5 + -8) - (long)pvVar1);
    }
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != 0);
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, Assignment)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;

    ParticleArray particles, particlesCopy, particlesAnotherCopy;
    for (int i = 0; i < 9; i++)
        particles.pushBack(this->randomParticle());
    for (int i = 0; i < 11; i++)
        particlesCopy.pushBack(this->randomParticle());
    particlesCopy = particles;
    particlesAnotherCopy = particles;
    ASSERT_TRUE(this->eqParticleArrays(particles, particlesCopy));
    ASSERT_TRUE(this->eqParticleArrays(particles, particlesAnotherCopy));
}